

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O0

int genaNotifyAllCommon(UpnpDevice_Handle device_handle,char *UDN,char *servId,char *propertySet)

{
  Upnp_Handle_Type UVar1;
  uri_type *puVar2;
  ThreadPoolJob *job_00;
  ListNode *pLVar3;
  long lVar4;
  ListNode *node;
  ThreadPoolJob *job;
  Handle_Info *handle_info;
  service_info *service;
  subscription *finger;
  notify_thread_struct *thread_s;
  char *headers;
  char *servId_copy;
  char *UDN_copy;
  int *reference_count;
  int line;
  int ret;
  char *propertySet_local;
  char *servId_local;
  char *UDN_local;
  UpnpDevice_Handle device_handle_local;
  
  reference_count._4_4_ = 0;
  reference_count._0_4_ = 0;
  UDN_copy = (char *)0x0;
  servId_copy = (char *)0x0;
  headers = (char *)0x0;
  thread_s = (notify_thread_struct *)0x0;
  finger = (subscription *)0x0;
  service = (service_info *)0x0;
  handle_info = (Handle_Info *)0x0;
  _line = propertySet;
  propertySet_local = servId;
  servId_local = UDN;
  UDN_local._4_4_ = device_handle;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x337,"GENA BEGIN NOTIFY ALL COMMON\n");
  UDN_copy = (char *)malloc(4);
  if (UDN_copy == (char *)0x0) {
    reference_count._0_4_ = 0x33d;
    reference_count._4_4_ = 0xffffff98;
  }
  else {
    UDN_copy[0] = '\0';
    UDN_copy[1] = '\0';
    UDN_copy[2] = '\0';
    UDN_copy[3] = '\0';
    servId_copy = strdup(servId_local);
    if (servId_copy == (char *)0x0) {
      reference_count._0_4_ = 0x345;
      reference_count._4_4_ = 0xffffff98;
    }
    else {
      headers = strdup(propertySet_local);
      if (headers == (char *)0x0) {
        reference_count._0_4_ = 0x34c;
        reference_count._4_4_ = 0xffffff98;
      }
      else {
        thread_s = (notify_thread_struct *)AllocGenaHeaders(_line);
        if (thread_s == (notify_thread_struct *)0x0) {
          reference_count._0_4_ = 0x353;
          reference_count._4_4_ = 0xffffff98;
        }
        else {
          HandleLock(".upnp/src/gena/gena_device.c",0x358);
          UVar1 = GetHandleInfo(UDN_local._4_4_,(Handle_Info **)&job);
          if (UVar1 == HND_DEVICE) {
            handle_info = (Handle_Info *)
                          FindServiceId((service_table *)&job[0xc].requestTime.tv_usec,
                                        propertySet_local,servId_local);
            if (handle_info == (Handle_Info *)0x0) {
              reference_count._0_4_ = 0x3a3;
              reference_count._4_4_ = 0xffffff91;
            }
            else {
              for (service = (service_info *)GetFirstSubscription((service_info *)handle_info);
                  service != (service_info *)0x0;
                  service = (service_info *)
                            GetNextSubscription((service_info *)handle_info,(subscription *)service)
                  ) {
                finger = (subscription *)malloc(0x68);
                if (finger == (subscription *)0x0) {
                  reference_count._0_4_ = 0x369;
                  reference_count._4_4_ = 0xffffff98;
                  break;
                }
                *(int *)UDN_copy = *(int *)UDN_copy + 1;
                (finger->outgoing).head.prev = (LISTNODE *)UDN_copy;
                *(char **)(finger->sid + 0x18) = servId_copy;
                *(char **)(finger->sid + 0x10) = headers;
                *(notify_thread_struct **)finger->sid = thread_s;
                *(char **)(finger->sid + 8) = _line;
                strncpy(finger->sid + 0x20,(char *)service,0x2c);
                *(undefined1 *)((long)&(finger->DeliveryURLs).URLs + 3) = 0;
                puVar2 = (uri_type *)time((time_t *)0x0);
                (finger->DeliveryURLs).parsedURLs = puVar2;
                *(UpnpDevice_Handle *)&(finger->outgoing).head.next = UDN_local._4_4_;
                maybeDiscardEvents((LinkedList *)&service[1].SCPDURL);
                job_00 = (ThreadPoolJob *)malloc(0x30);
                if (job_00 == (ThreadPoolJob *)0x0) {
                  free(finger);
                  reference_count._0_4_ = 0x380;
                  reference_count._4_4_ = 0xffffff98;
                  break;
                }
                memset(job_00,0,0x30);
                TPJobInit(job_00,genaNotifyThread,finger);
                TPJobSetFreeFunction(job_00,free_notify_struct);
                TPJobSetPriority(job_00,MED_PRIORITY);
                pLVar3 = ListAddTail((LinkedList *)&service[1].SCPDURL,job_00);
                lVar4 = ListSize((LinkedList *)&service[1].SCPDURL);
                if (lVar4 == 1) {
                  reference_count._4_4_ = ThreadPoolAdd(&gSendThreadPool,job_00,(int *)0x0);
                  if (reference_count._4_4_ != 0) {
                    reference_count._0_4_ = 0x394;
                    if (reference_count._4_4_ == 0x20000000) {
                      reference_count._0_4_ = 0x396;
                      reference_count._4_4_ = 0xffffff98;
                    }
                    break;
                  }
                  if (pLVar3 != (ListNode *)0x0) {
                    *(undefined4 *)((long)pLVar3->item + 0x2c) = 0x1fffffff;
                  }
                }
              }
            }
          }
          else {
            reference_count._0_4_ = 0x35b;
            reference_count._4_4_ = 0xffffff9c;
          }
        }
      }
    }
  }
  if ((UDN_copy != (char *)0x0) && (*(int *)UDN_copy == 0)) {
    free(thread_s);
    ixmlFreeDOMString(_line);
    free(headers);
    free(servId_copy);
    free(UDN_copy);
  }
  HandleUnlock(".upnp/src/gena/gena_device.c",0x3b5);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",(int)reference_count,
             "GENA END NOTIFY ALL COMMON, ret = %d\n",(ulong)reference_count._4_4_);
  return reference_count._4_4_;
}

Assistant:

static int genaNotifyAllCommon(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	DOMString propertySet)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	int *reference_count = NULL;
	char *UDN_copy = NULL;
	char *servId_copy = NULL;
	char *headers = NULL;
	notify_thread_struct *thread_s = NULL;

	subscription *finger = NULL;
	service_info *service = NULL;
	struct Handle_Info *handle_info;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENA BEGIN NOTIFY ALL COMMON\n");

	/* Keep this allocation first */
	reference_count = (int *)malloc(sizeof(int));
	if (reference_count == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}
	*reference_count = 0;

	UDN_copy = strdup(UDN);
	if (UDN_copy == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	servId_copy = strdup(servId);
	if (servId_copy == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	headers = AllocGenaHeaders(propertySet);
	if (headers == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	HandleLock(__FILE__, __LINE__);

	if (GetHandleInfo(device_handle, &handle_info) != HND_DEVICE) {
		line = __LINE__;
		ret = GENA_E_BAD_HANDLE;
	} else {
		service =
			FindServiceId(&handle_info->ServiceTable, servId, UDN);
		if (service != NULL) {
			finger = GetFirstSubscription(service);
			while (finger) {
				ThreadPoolJob *job = NULL;
				ListNode *node;

				thread_s = (notify_thread_struct *)malloc(
					sizeof(notify_thread_struct));
				if (thread_s == NULL) {
					line = __LINE__;
					ret = UPNP_E_OUTOF_MEMORY;
					break;
				}

				(*reference_count)++;
				thread_s->reference_count = reference_count;
				thread_s->UDN = UDN_copy;
				thread_s->servId = servId_copy;
				thread_s->headers = headers;
				thread_s->propertySet = propertySet;
				strncpy(thread_s->sid,
					finger->sid,
					sizeof thread_s->sid);
				thread_s->sid[sizeof thread_s->sid - 1] = 0;
				thread_s->ctime = time(0);
				thread_s->device_handle = device_handle;

				maybeDiscardEvents(&finger->outgoing);
				job = (ThreadPoolJob *)malloc(
					sizeof(ThreadPoolJob));
				if (!job) {
					free(thread_s);
					line = __LINE__;
					ret = UPNP_E_OUTOF_MEMORY;
					break;
				}
				memset(job, 0, sizeof(ThreadPoolJob));
				TPJobInit(job,
					(start_routine)genaNotifyThread,
					thread_s);
				TPJobSetFreeFunction(
					job, (free_routine)free_notify_struct);
				TPJobSetPriority(job, MED_PRIORITY);
				node = ListAddTail(&finger->outgoing, job);

				/* If there is only one element on the list
				   (which we just
				   added), need to kickstart the threadpool */
				if (ListSize(&finger->outgoing) == 1) {
					ret = ThreadPoolAdd(
						&gSendThreadPool, job, NULL);
					if (ret != 0) {
						line = __LINE__;
						if (ret == EOUTOFMEM) {
							line = __LINE__;
							ret = UPNP_E_OUTOF_MEMORY;
						}
						break;
					}
					if (node) {
						((ThreadPoolJob *)(node->item))
							->jobId = STALE_JOBID;
					}
				}
				finger = GetNextSubscription(service, finger);
			}
		} else {
			line = __LINE__;
			ret = GENA_E_BAD_SERVICE;
		}
	}

ExitFunction:
	/* The only case where we want to free memory here is if the
	   struct was never queued. Else, let the normal cleanup take place.
	   reference_count is allocated first so it's ok to do nothing if it's 0
	*/
	if (reference_count && *reference_count == 0) {
		free(headers);
		ixmlFreeDOMString(propertySet);
		free(servId_copy);
		free(UDN_copy);
		free(reference_count);
	}

	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END NOTIFY ALL COMMON, ret = %d\n",
		ret);

	return ret;
}